

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * __thiscall
duckdb_apache::thrift::
to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::KeyValue_const*,std::vector<duckdb_parquet::KeyValue,std::allocator<duckdb_parquet::KeyValue>>>>
          (string *__return_storage_ptr__,thrift *this,
          __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
          *beg,__normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
               *end)

{
  KeyValue *t;
  ostringstream o;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (t = *(KeyValue **)this; t != beg->_M_current; t = t + 1) {
    if (t != *(KeyValue **)this) {
      std::operator<<((ostream *)local_1a8,", ");
    }
    to_string<duckdb_parquet::KeyValue>(&local_1c8,t);
    std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}